

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbrz.cpp
# Opt level: O3

void (anonymous_namespace)::Scaler3x<(anonymous_namespace)::ColorGradientRGB>::alphaGrad<45u,100u>
               (uint32_t *pixBack,uint32_t pixFront)

{
  uint uVar1;
  byte bVar2;
  
  bVar2 = (byte)(pixFront >> 8);
  uVar1 = *pixBack;
  *pixBack = (((uVar1 >> 8 & 0xff) * 0x37 + ((uint)bVar2 + (uint)bVar2 * 8) * 5) * 0x147b >> 0xb &
             0xff00) + ((uVar1 & 0xff) * 0x37 + (pixFront & 0xff) * 0x2d) / 100 +
             (((uVar1 >> 0x10 & 0xff) * 0x37 + (pixFront >> 0x10 & 0xff) * 0x2d) * 0x147b >> 3 &
             0x1ff0000);
  return;
}

Assistant:

static void alphaGrad(uint32_t& pixBack, uint32_t pixFront) { ColorGradient::template alphaGrad<M, N>(pixBack, pixFront); }